

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

int __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::bind
          (reactive_socket_service<asio::ip::udp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  int iVar1;
  int *piVar2;
  undefined4 in_register_0000000c;
  error_code *this_00;
  undefined4 in_register_00000034;
  
  this_00 = (error_code *)CONCAT44(in_register_0000000c,__len);
  if (*(int *)CONCAT44(in_register_00000034,__fd) == -1) {
    std::error_code::operator=(this_00,bad_descriptor);
  }
  else {
    __len_00 = 0x1c;
    if (__addr->sa_family == 2) {
      __len_00 = 0x10;
    }
    iVar1 = ::bind(*(int *)CONCAT44(in_register_00000034,__fd),__addr,__len_00);
    if (iVar1 == 0) {
      this_00->_M_value = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (system_category()::instance == '\0') {
        bind();
      }
      this_00->_M_value = iVar1;
      this_00->_M_cat = (error_category *)&system_category()::instance;
    }
  }
  return this_00->_M_value;
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }